

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddMultisigSignData(void *handle,void *multisign_handle,char *signature,char *related_pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  string pubkey_str;
  Pubkey key;
  string sig_str;
  ByteData signature_bytes;
  CfdCapiMultisigSignData *data;
  string *in_stack_fffffffffffffdf0;
  allocator *paVar3;
  CfdError in_stack_fffffffffffffdfc;
  CfdException *in_stack_fffffffffffffe00;
  string local_1a8;
  allocator local_181;
  string local_180;
  Pubkey local_160;
  string local_148;
  allocator local_121;
  string local_120 [8];
  string *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ByteData local_100;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  long local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  allocator local_59;
  string local_58 [48];
  char *local_28;
  char *local_20;
  long local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"MultisigSign",&local_59);
  cfd::capi::CheckBuffer((void *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (local_20 == (char *)0x0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x77c;
    local_78.funcname = "CfdAddMultisigSignData";
    cfd::core::logger::warn<>(&local_78,"signature is null.");
    local_9a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Failed to parameter. signature is null.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
    local_9a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a8 = local_18;
  if (0x13 < *(uint *)(local_18 + 0x15c8)) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x786;
    local_c0.funcname = "CfdAddMultisigSignData";
    cfd::core::logger::warn<>(&local_c0,"The number of signature has reached the upper limit.");
    local_e2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"The number of signature has reached the upper limit.",&local_e1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
    local_e2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,local_20,&local_121);
    cfd::core::ByteData::ByteData(&local_100,(string *)local_120);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_148,&local_100);
    std::__cxx11::string::copy
              ((char *)&local_148,local_a8 + 0x10 + (ulong)*(uint *)(local_a8 + 0x15c8) * 0x93,0x92)
    ;
    std::__cxx11::string::~string((string *)&local_148);
    cfd::core::ByteData::~ByteData((ByteData *)0x6198c3);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    paVar3 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,local_28,paVar3);
    cfd::core::Pubkey::Pubkey(&local_160,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1a8,&local_160);
    std::__cxx11::string::copy
              ((char *)&local_1a8,local_a8 + 0xb8c + (ulong)*(uint *)(local_a8 + 0x15c8) * 0x83,0x82
              );
    std::__cxx11::string::~string((string *)&local_1a8);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x619a4a);
  }
  *(int *)(local_a8 + 0x15c8) = *(int *)(local_a8 + 0x15c8) + 1;
  return 0;
}

Assistant:

int CfdAddMultisigSignData(
    void* handle, void* multisign_handle, const char* signature,
    const char* related_pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(multisign_handle, kPrefixMultisigSignData);
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    CfdCapiMultisigSignData* data =
        static_cast<CfdCapiMultisigSignData*>(multisign_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    if (!IsEmptyString(signature)) {
      ByteData signature_bytes = ByteData(std::string(signature));
      std::string sig_str = signature_bytes.GetHex();
      sig_str.copy(data->signatures[data->current_index], kSignatureHexSize);
    }

    if (!IsEmptyString(related_pubkey)) {
      Pubkey key = Pubkey(std::string(related_pubkey));
      std::string pubkey_str = key.GetHex();
      pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    }

    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}